

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmGeneratorTarget::GetModuleDefinitionFile(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  reference ppcVar2;
  reference ppcVar3;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_180;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_178;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_170;
  const_iterator si;
  TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  visitor;
  undefined1 local_50 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> data;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_50);
  GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_50,config);
  TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  ::TagVisitor((TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                *)&si,this,
               (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
               &sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_178._M_current =
       (cmSourceFile **)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                 ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_50);
  __gnu_cxx::
  __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>::
  __normal_iterator<cmSourceFile**>
            ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
              *)&local_170,&local_178);
  while( true ) {
    local_180._M_current =
         (cmSourceFile **)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_50);
    bVar1 = __gnu_cxx::operator!=(&local_170,&local_180);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&local_170);
    TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::Accept((TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              *)&si,*ppcVar2);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&local_170);
  }
  TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  ::~TagVisitor((TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                 *)&si);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_50);
  bVar1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::empty
                    ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                     &sourceFiles.
                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    this_local = (cmGeneratorTarget *)0x0;
  }
  else {
    ppcVar3 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::front
                        ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                         &sourceFiles.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local = (cmGeneratorTarget *)*ppcVar3;
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile const*
cmGeneratorTarget::GetModuleDefinitionFile(const std::string& config) const
{
  std::vector<cmSourceFile const*> data;
  IMPLEMENT_VISIT_IMPL(ModuleDefinitionFile,
                       COMMA std::vector<cmSourceFile const*>)
  if(!data.empty())
    {
    return data.front();
    }

  return 0;
}